

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry.c
# Opt level: O0

void PrintFinalStats(void *cvode_mem)

{
  int iVar1;
  undefined8 in_RDI;
  int retval;
  long nfeLS;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  long leniwLS;
  long lenrwLS;
  long leniw;
  long lenrw;
  char *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  iVar1 = CVodeGetWorkSpace(in_RDI,&local_10,&local_18);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumSteps(local_8,&local_30);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumRhsEvals(local_8,&local_38);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumLinSolvSetups(local_8,&local_40);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumErrTestFails(local_8,&local_58);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumNonlinSolvIters(local_8,&local_48);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumNonlinSolvConvFails(local_8,&local_50);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetLinWorkSpace(local_8,&local_20,&local_28);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumLinIters(local_8,&local_60);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumPrecEvals(local_8,&local_68);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumPrecSolves(local_8,&local_70);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumLinConvFails(local_8,&stack0xffffffffffffff88);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  iVar1 = CVodeGetNumLinRhsEvals(local_8,&stack0xffffffffffffff80);
  check_retval(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,iVar1);
  printf("\nFinal Statistics.. \n\n");
  printf("lenrw   = %5ld     leniw   = %5ld\n",local_10,local_18);
  printf("lenrwLS = %5ld     leniwLS = %5ld\n",local_20,local_28);
  printf("nst     = %5ld\n",local_30);
  printf("nfe     = %5ld     nfeLS   = %5ld\n",local_38,in_stack_ffffffffffffff80);
  printf("nni     = %5ld     nli     = %5ld\n",local_48,local_60);
  printf("nsetups = %5ld     netf    = %5ld\n",local_40,local_58);
  printf("npe     = %5ld     nps     = %5ld\n",local_68,local_70);
  printf("ncfn    = %5ld     ncfl    = %5ld\n\n",local_50,in_stack_ffffffffffffff88);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem)
{
  long int lenrw, leniw;
  long int lenrwLS, leniwLS;
  long int nst, nfe, nsetups, nni, ncfn, netf;
  long int nli, npe, nps, ncfl, nfeLS;
  int retval;

  retval = CVodeGetWorkSpace(cvode_mem, &lenrw, &leniw);
  check_retval(&retval, "CVodeGetWorkSpace", 1);
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);

  retval = CVodeGetLinWorkSpace(cvode_mem, &lenrwLS, &leniwLS);
  check_retval(&retval, "CVodeGetLinWorkSpace", 1);
  retval = CVodeGetNumLinIters(cvode_mem, &nli);
  check_retval(&retval, "CVodeGetNumLinIters", 1);
  retval = CVodeGetNumPrecEvals(cvode_mem, &npe);
  check_retval(&retval, "CVodeGetNumPrecEvals", 1);
  retval = CVodeGetNumPrecSolves(cvode_mem, &nps);
  check_retval(&retval, "CVodeGetNumPrecSolves", 1);
  retval = CVodeGetNumLinConvFails(cvode_mem, &ncfl);
  check_retval(&retval, "CVodeGetNumLinConvFails", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  printf("\nFinal Statistics.. \n\n");
  printf("lenrw   = %5ld     leniw   = %5ld\n", lenrw, leniw);
  printf("lenrwLS = %5ld     leniwLS = %5ld\n", lenrwLS, leniwLS);
  printf("nst     = %5ld\n", nst);
  printf("nfe     = %5ld     nfeLS   = %5ld\n", nfe, nfeLS);
  printf("nni     = %5ld     nli     = %5ld\n", nni, nli);
  printf("nsetups = %5ld     netf    = %5ld\n", nsetups, netf);
  printf("npe     = %5ld     nps     = %5ld\n", npe, nps);
  printf("ncfn    = %5ld     ncfl    = %5ld\n\n", ncfn, ncfl);
}